

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O1

file_handle __thiscall
libtorrent::aux::part_file::open_file(part_file *this,open_mode_t mode,error_code *ec)

{
  undefined4 in_register_00000034;
  size_t *psVar1;
  char *in_R9;
  string_view name;
  string_view lhs;
  string_view rhs;
  string fn;
  string local_60;
  
  psVar1 = (size_t *)CONCAT44(in_register_00000034,mode.m_val);
  lhs._M_str = (char *)psVar1[5];
  lhs._M_len = *psVar1;
  rhs._M_str = in_R9;
  rhs._M_len = psVar1[4];
  combine_path_abi_cxx11_(&local_60,(libtorrent *)psVar1[1],lhs,rhs);
  name._M_str = local_60._M_dataplus._M_p;
  name._M_len = local_60._M_string_length;
  file_handle::file_handle((file_handle *)this,name,0,(open_mode_t)(uint)ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return (file_handle)(handle_type)this;
}

Assistant:

aux::file_handle part_file::open_file(aux::open_mode_t const mode, error_code& ec) try
	{
		std::string const fn = combine_path(m_path, m_name);
		try {
			return aux::file_handle(fn, 0, mode);
		}
		catch (storage_error const& e)
		{
			if ((mode & aux::open_mode::write)
				&& e.ec == boost::system::errc::no_such_file_or_directory)
			{
				// this means the directory the file is in doesn't exist.
				// so create it
				ec.clear();
				create_directories(m_path, ec);
				if (ec) return {};
				return aux::file_handle(fn, 0, mode);
			}
			return {};
		}
	}
	catch (storage_error const& e)
	{
		ec = e.ec;
		return {};
	}